

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

tnt_error tnt_io_nonblock(tnt_stream_net *s,int set)

{
  int iVar1;
  int *piVar2;
  uint local_20;
  int flags;
  int set_local;
  tnt_stream_net *s_local;
  
  local_20 = fcntl(s->fd,3);
  if (local_20 == 0xffffffff) {
    piVar2 = __errno_location();
    s->errno_ = *piVar2;
    s_local._4_4_ = TNT_ESYSTEM;
  }
  else {
    if (set == 0) {
      local_20 = local_20 & 0xfffff7ff;
    }
    else {
      local_20 = local_20 | 0x800;
    }
    iVar1 = fcntl(s->fd,4,(ulong)local_20);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      s->errno_ = *piVar2;
      s_local._4_4_ = TNT_ESYSTEM;
    }
    else {
      s_local._4_4_ = TNT_EOK;
    }
  }
  return s_local._4_4_;
}

Assistant:

static enum tnt_error
tnt_io_nonblock(struct tnt_stream_net *s, int set)
{
	int flags = fcntl(s->fd, F_GETFL);
	if (flags == -1) {
		s->errno_ = errno;
		return TNT_ESYSTEM;
	}
	if (set)
		flags |= O_NONBLOCK;
	else
		flags &= ~O_NONBLOCK;
	if (fcntl(s->fd, F_SETFL, flags) == -1) {
		s->errno_ = errno;
		return TNT_ESYSTEM;
	}
	return TNT_EOK;
}